

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

bool __thiscall cs::numeric::operator<(numeric *this,numeric *rhs)

{
  uint8_t uVar1;
  longdouble *in_RSI;
  longdouble *in_RDI;
  bool local_1;
  
  uVar1 = get_composite_type((bool)(*(byte *)(in_RDI + 1) & 1),(bool)(*(byte *)(in_RSI + 1) & 1));
  switch(uVar1) {
  default:
    local_1 = *in_RDI < *in_RSI;
    break;
  case '\x01':
    local_1 = *in_RDI < (longdouble)*(long *)in_RSI;
    break;
  case '\x02':
    local_1 = (longdouble)*(long *)in_RDI < *in_RSI;
    break;
  case '\x03':
    local_1 = *(long *)in_RDI < *(long *)in_RSI;
  }
  return local_1;
}

Assistant:

bool operator<(const numeric &rhs) const noexcept
		{
			switch (get_composite_type(type, rhs.type)) {
			default:
			case 0b00:
				return data._num < rhs.data._num;
			case 0b01:
				return data._num < rhs.data._int;
			case 0b10:
				return data._int < rhs.data._num;
			case 0b11:
				return data._int < rhs.data._int;
			}
		}